

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSession.cpp
# Opt level: O1

void __thiscall
ki::protocol::net::ServerSession::send_keep_alive
          (ServerSession *this,uint32_t milliseconds_since_startup)

{
  undefined8 uVar1;
  ServerKeepAlive keep_alive;
  ServerKeepAlive local_20;
  
  if ((&this->field_0x38)[(long)this->_vptr_ServerSession[-3]] == '\0') {
    (&this->field_0x38)[(long)this->_vptr_ServerSession[-3]] = 1;
    control::ServerKeepAlive::ServerKeepAlive(&local_20,milliseconds_since_startup);
    Session::send_packet
              ((Session *)((long)&this->_vptr_ServerSession + (long)this->_vptr_ServerSession[-3]),
               true,'\x03',&local_20.super_Serializable);
    uVar1 = std::chrono::_V2::steady_clock::now();
    *(undefined8 *)(&this->field_0x30 + (long)this->_vptr_ServerSession[-3]) = uVar1;
  }
  return;
}

Assistant:

void ServerSession::send_keep_alive(const uint32_t milliseconds_since_startup)
	{
		// Don't send a keep alive if we're waiting for a response
		if (m_waiting_for_keep_alive_response)
			return;
		m_waiting_for_keep_alive_response = true;

		// Send a KEEP_ALIVE packet
		const control::ServerKeepAlive keep_alive(milliseconds_since_startup);
		send_packet(true, (uint8_t)control::Opcode::KEEP_ALIVE, keep_alive);
		m_last_sent_heartbeat_time = std::chrono::steady_clock::now();
	}